

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O1

uintptr_t lj_trace_unwind(jit_State *J,uintptr_t addr,ExitNo *ep)

{
  uint64_t uVar1;
  ulong uVar2;
  MCode *pMVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4._0_2_ = J[-1].penalty[0x2e].val;
  uVar4._2_2_ = J[-1].penalty[0x2e].reason;
  uVar1 = J->trace[uVar4].gcptr64;
  if ((uVar1 != 0) && (uVar2 = *(ulong *)(uVar1 + 0x58), uVar2 <= addr)) {
    pMVar3 = (MCode *)0x0;
    if (addr < *(uint *)(uVar1 + 0x54) + uVar2) {
      uVar4 = (uint)*(ushort *)(uVar1 + 10);
      do {
        uVar5 = (int)pMVar3 + uVar4 >> 1;
        if ((ulong)*(ushort *)(*(long *)(uVar1 + 0x30) + 6 + (ulong)uVar5 * 0xc) <= addr - uVar2) {
          pMVar3 = (MCode *)(ulong)(uVar5 + 1);
          uVar5 = uVar4;
        }
        uVar4 = uVar5;
      } while ((uint)pMVar3 < uVar4);
      *ep = uVar4 - 1;
      pMVar3 = J->exitstubgroup[uVar4 - 1 >> 5] + (uVar4 * 4 - 4 & 0x7c);
    }
    return (uintptr_t)pMVar3;
  }
  return 0;
}

Assistant:

uintptr_t LJ_FASTCALL lj_trace_unwind(jit_State *J, uintptr_t addr, ExitNo *ep)
{
#if EXITTRACE_VMSTATE
  TraceNo traceno = J2G(J)->vmstate;
#else
  TraceNo traceno = trace_exit_find(J, (MCode *)addr);
#endif
  GCtrace *T = traceref(J, traceno);
  if (T
#if EXITTRACE_VMSTATE
      && addr >= (uintptr_t)T->mcode && addr < (uintptr_t)T->mcode + T->szmcode
#endif
     ) {
    SnapShot *snap = T->snap;
    SnapNo lo = 0, exitno = T->nsnap;
    uintptr_t ofs = (uintptr_t)((MCode *)addr - T->mcode);  /* MCode units! */
    /* Rightmost binary search for mcode offset to determine exit number. */
    do {
      SnapNo mid = (lo+exitno) >> 1;
      if (ofs < snap[mid].mcofs) exitno = mid; else lo = mid + 1;
    } while (lo < exitno);
    exitno--;
    *ep = exitno;
#ifdef EXITSTUBS_PER_GROUP
    return (uintptr_t)exitstub_addr(J, exitno);
#else
    return (uintptr_t)exitstub_trace_addr(T, exitno);
#endif
  }
  /* Cannot correlate addr with trace/exit. This will be fatal. */
  lj_assertJ(0, "bad exit pc");
  return 0;
}